

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

SpatialSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  Vec3fa *pVVar1;
  PrimRef *pPVar2;
  int *piVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  ulong uVar8;
  PrimRef *pPVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  size_t i;
  long lVar15;
  ulong uVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t dim;
  ulong uVar26;
  undefined1 *puVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar37;
  float fVar38;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  SpatialBinMapping<16UL> mapping;
  TriangleSplitter splitter;
  vint4 bin1;
  vint4 bin0;
  SpatialBinner binner;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_9a0;
  undefined8 local_990;
  undefined8 uStack_988;
  SpatialSplit *apSStack_980 [2];
  size_t local_970;
  TriangleSplitterFactory *local_968;
  ulong local_960;
  Geometry *local_958;
  ulong local_950;
  long local_948;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_940;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_930;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_920;
  undefined1 local_910 [4];
  float afStack_90c [7];
  undefined1 local_8f0 [16];
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_880;
  float local_870 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_830 [91];
  int local_280 [2];
  undefined8 auStack_278 [31];
  int local_180 [2];
  undefined8 auStack_178 [41];
  
  lVar15 = 0x700;
  paVar17 = local_830;
  do {
    ((undefined1 (*) [16])paVar17)[-1] = _DAT_01feb9f0;
    *paVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)_DAT_01feba00;
    ((undefined1 (*) [16])paVar17)[-3] = _DAT_01feb9f0;
    ((undefined1 (*) [16])paVar17)[-2] = _DAT_01feba00;
    ((undefined1 (*) [16])paVar17)[-5] = _DAT_01feb9f0;
    ((undefined1 (*) [16])paVar17)[-4] = _DAT_01feba00;
    *(undefined8 *)((long)&local_880.field_1.x + lVar15) = 0;
    *(undefined8 *)((long)&local_880 + lVar15 + 8U) = 0;
    *(undefined8 *)((long)apSStack_980 + lVar15) = 0;
    *(undefined8 *)((long)apSStack_980 + lVar15 + 8) = 0;
    paVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)((undefined1 (*) [16])paVar17 + 6);
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x800);
  local_940.v[0] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
  local_940.v[1] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
  local_940.v[2] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
  local_940.v[3] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3];
  pVVar1 = &(set->super_CentGeomBBox3fa).geomBounds.upper;
  fVar42 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
  fVar43 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3];
  auVar31._0_8_ =
       *(ulong *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 & 0x7fffffff7fffffff;
  auVar31._8_4_ = ABS(local_940.v[2]);
  auVar31._12_4_ = ABS(local_940.v[3]);
  auVar53._0_8_ = *(ulong *)&pVVar1->field_0 & 0x7fffffff7fffffff;
  auVar53._8_4_ = ABS(fVar42);
  auVar53._12_4_ = ABS(fVar43);
  auVar32 = maxps(auVar31,auVar53);
  fVar30 = auVar32._0_4_ * 1.5258789e-05;
  fVar37 = auVar32._4_4_ * 1.5258789e-05;
  auVar54._4_4_ = fVar37;
  auVar54._0_4_ = fVar30;
  fVar38 = auVar32._8_4_ * 1.5258789e-05;
  fVar39 = auVar32._12_4_ * 1.5258789e-05;
  fVar40 = (pVVar1->field_0).m128[0] - local_940.v[0];
  fVar41 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1] - local_940.v[1];
  fVar42 = fVar42 - local_940.v[2];
  fVar43 = fVar43 - local_940.v[3];
  auVar54._8_4_ = fVar38;
  auVar54._12_4_ = fVar39;
  auVar32._4_4_ = fVar41;
  auVar32._0_4_ = fVar40;
  auVar32._8_4_ = fVar42;
  auVar32._12_4_ = fVar43;
  auVar32 = maxps(auVar54,auVar32);
  auVar32 = divps(_DAT_01fecb50,auVar32);
  local_930.i[0] = -(uint)(fVar30 < fVar40) & auVar32._0_4_;
  local_930.i[1] = -(uint)(fVar37 < fVar41) & auVar32._4_4_;
  local_930.i[2] = -(uint)(fVar38 < fVar42) & auVar32._8_4_;
  local_930.i[3] = -(uint)(fVar39 < fVar43) & auVar32._12_4_;
  auVar48._4_4_ = local_930.i[1];
  auVar48._0_4_ = local_930.i[0];
  auVar48._8_4_ = local_930.i[2];
  auVar48._12_4_ = local_930.i[3];
  local_920 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(_DAT_01feca10,auVar48);
  uVar16 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  if (uVar16 < uVar8) {
    pPVar9 = this->prims0;
    local_968 = this->splitterFactory;
    do {
      puVar27 = local_910;
      pPVar2 = pPVar9 + uVar16;
      if ((uint)pPVar9[uVar16].lower.field_0.m128[3] < 0x10000000) {
        auVar50._0_4_ =
             (int)((((pPVar2->lower).field_0.m128[0] + (pPVar2->upper).field_0.m128[0]) * 0.5 -
                   local_940.v[0]) * local_930.v[0] + -0.5);
        auVar50._4_4_ =
             (int)((((pPVar2->lower).field_0.m128[1] + (pPVar2->upper).field_0.m128[1]) * 0.5 -
                   local_940.v[1]) * local_930.v[1] + -0.5);
        auVar50._8_4_ =
             (int)((((pPVar2->lower).field_0.m128[2] + (pPVar2->upper).field_0.m128[2]) * 0.5 -
                   local_940.v[2]) * local_930.v[2] + -0.5);
        auVar50._12_4_ =
             (int)((((pPVar2->lower).field_0.m128[3] + (pPVar2->upper).field_0.m128[3]) * 0.5 -
                   local_940.v[3]) * local_930.v[3] + -0.5);
        auVar36._0_4_ = -(uint)(0xe < auVar50._0_4_);
        auVar36._4_4_ = -(uint)(0xe < auVar50._4_4_);
        auVar36._8_4_ = -(uint)(0xe < auVar50._8_4_);
        auVar36._12_4_ = -(uint)(0xe < auVar50._12_4_);
        auVar50 = ~auVar36 & auVar50;
        auVar51._0_4_ = auVar50._0_4_ >> 0x1f;
        auVar51._4_4_ = auVar50._4_4_ >> 0x1f;
        auVar51._8_4_ = auVar50._8_4_ >> 0x1f;
        auVar51._12_4_ = auVar50._12_4_ >> 0x1f;
        _local_910 = ~auVar51 & (auVar36 & _DAT_01fecb70 | auVar50);
        lVar15 = 0;
        do {
          lVar21 = (long)*(int *)(local_910 + lVar15);
          aVar6 = (pPVar2->lower).field_0;
          aVar7 = (pPVar2->upper).field_0;
          piVar3 = (int *)((long)local_280 + lVar15 + lVar21 * 0x10);
          *piVar3 = *piVar3 + 1;
          piVar3 = (int *)((long)local_180 + lVar15 + lVar21 * 0x10);
          *piVar3 = *piVar3 + 1;
          auVar48 = minps(*(undefined1 (*) [16])((long)&local_880 + lVar15 * 8 + lVar21 * 0x60),
                          (undefined1  [16])aVar6);
          auVar32 = maxps(*(undefined1 (*) [16])((long)local_870 + lVar15 * 8 + lVar21 * 0x60),
                          (undefined1  [16])aVar7);
          *(undefined1 (*) [16])((long)&local_880 + lVar15 * 8 + lVar21 * 0x60) = auVar48;
          *(undefined1 (*) [16])((long)local_870 + lVar15 * 8 + lVar21 * 0x60) = auVar32;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0xc);
      }
      else {
        auVar44._0_4_ =
             (int)(((pPVar2->lower).field_0.m128[0] - local_940.v[0]) * local_930.v[0] + -0.5);
        auVar44._4_4_ =
             (int)(((pPVar2->lower).field_0.m128[1] - local_940.v[1]) * local_930.v[1] + -0.5);
        auVar44._8_4_ =
             (int)(((pPVar2->lower).field_0.m128[2] - local_940.v[2]) * local_930.v[2] + -0.5);
        auVar44._12_4_ =
             (int)(((pPVar2->lower).field_0.m128[3] - local_940.v[3]) * local_930.v[3] + -0.5);
        auVar33._0_4_ = -(uint)(0xe < auVar44._0_4_);
        auVar33._4_4_ = -(uint)(0xe < auVar44._4_4_);
        auVar33._8_4_ = -(uint)(0xe < auVar44._8_4_);
        auVar33._12_4_ = -(uint)(0xe < auVar44._12_4_);
        auVar44 = ~auVar33 & auVar44;
        auVar45._0_4_ = auVar44._0_4_ >> 0x1f;
        auVar45._4_4_ = auVar44._4_4_ >> 0x1f;
        auVar45._8_4_ = auVar44._8_4_ >> 0x1f;
        auVar45._12_4_ = auVar44._12_4_ >> 0x1f;
        local_890 = ~auVar45 & (auVar33 & _DAT_01fecb70 | auVar44);
        auVar46._0_4_ =
             (int)(((pPVar2->upper).field_0.m128[0] - local_940.v[0]) * local_930.v[0] + -0.5);
        auVar46._4_4_ =
             (int)(((pPVar2->upper).field_0.m128[1] - local_940.v[1]) * local_930.v[1] + -0.5);
        auVar46._8_4_ =
             (int)(((pPVar2->upper).field_0.m128[2] - local_940.v[2]) * local_930.v[2] + -0.5);
        auVar46._12_4_ =
             (int)(((pPVar2->upper).field_0.m128[3] - local_940.v[3]) * local_930.v[3] + -0.5);
        auVar34._0_4_ = -(uint)(0xe < auVar46._0_4_);
        auVar34._4_4_ = -(uint)(0xe < auVar46._4_4_);
        auVar34._8_4_ = -(uint)(0xe < auVar46._8_4_);
        auVar34._12_4_ = -(uint)(0xe < auVar46._12_4_);
        auVar46 = ~auVar34 & auVar46;
        auVar47._0_4_ = auVar46._0_4_ >> 0x1f;
        auVar47._4_4_ = auVar46._4_4_ >> 0x1f;
        auVar47._8_4_ = auVar46._8_4_ >> 0x1f;
        auVar47._12_4_ = auVar46._12_4_ >> 0x1f;
        local_8a0 = ~auVar47 & (auVar34 & _DAT_01fecb70 | auVar46);
        lVar15 = 0;
        do {
          fVar42 = *(float *)((long)&local_930 + lVar15 * 4);
          if ((fVar42 != 0.0) || (NAN(fVar42))) {
            uVar26 = (ulong)*(int *)(local_890 + lVar15 * 4);
            uVar25 = (ulong)*(int *)(local_8a0 + lVar15 * 4);
            if (*(int *)(local_890 + lVar15 * 4) == *(int *)(local_8a0 + lVar15 * 4)) {
              aVar6 = (pPVar2->lower).field_0;
              aVar7 = (pPVar2->upper).field_0;
              piVar3 = (int *)((long)local_280 + lVar15 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)((long)local_180 + lVar15 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              auVar48 = minps(*(undefined1 (*) [16])(&local_880 + uVar26 * 6 + lVar15 * 2U),
                              (undefined1  [16])aVar6);
              auVar32 = maxps(*(undefined1 (*) [16])
                               ((long)local_870 + lVar15 * 0x20 + uVar26 * 0x60),
                              (undefined1  [16])aVar7);
              (&local_880)[uVar26 * 6 + lVar15 * 2U] =
                   (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar48;
              *(undefined1 (*) [16])((long)local_870 + lVar15 * 0x20 + uVar26 * 0x60) = auVar32;
            }
            else {
              local_990 = *(undefined8 *)&(pPVar2->upper).field_0;
              uStack_988 = *(undefined8 *)((long)&(pPVar2->upper).field_0 + 8);
              local_9a0.field_1 =
                   *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&(pPVar2->lower).field_0.field_1;
              uVar19 = uVar26;
              uVar18 = uVar25;
              if (uVar25 < uVar26) {
                uVar18 = uVar26;
              }
              do {
                uVar23 = uVar19;
                uVar24 = uVar18;
                if (uVar25 <= uVar23) break;
                uVar19 = uVar23 + 1;
                uVar24 = uVar23;
              } while ((float)(uVar23 + 1) * *(float *)((long)&local_920 + lVar15 * 4) +
                       *(float *)((long)&local_940 + lVar15 * 4) <=
                       *(float *)((long)&local_9a0 + lVar15 * 4));
              uVar19 = uVar25;
              if (uVar24 < uVar25) {
                uVar18 = uVar25;
                do {
                  uVar19 = uVar18;
                  if ((float)uVar18 * *(float *)((long)&local_920 + lVar15 * 4) +
                      *(float *)((long)&local_940 + lVar15 * 4) <
                      *(float *)((long)&local_990 + lVar15 * 4)) break;
                  uVar18 = uVar18 - 1;
                  uVar19 = uVar24;
                } while (uVar24 < uVar18);
              }
              local_958 = (local_968->scene->geometries).items
                          [(uint)(pPVar2->lower).field_0.m128[3] & 0x7ffffff].ptr;
              lVar22 = (ulong)(uint)(pPVar2->upper).field_0.m128[3] *
                       local_958[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                       _M_i;
              lVar21 = *(long *)&local_958->field_0x58;
              local_948 = *(long *)&local_958[1].time_range.upper;
              local_950 = (ulong)*(uint *)(lVar21 + lVar22);
              p_Var10 = local_958[1].intersectionFilterN;
              pauVar4 = (undefined1 (*) [16])(local_948 + local_950 * (long)p_Var10);
              local_8e0 = *(float *)*pauVar4;
              fStack_8dc = *(float *)(*pauVar4 + 4);
              fStack_8d8 = *(float *)(*pauVar4 + 8);
              fStack_8d4 = *(float *)(*pauVar4 + 0xc);
              _local_910 = *pauVar4;
              pfVar5 = (float *)(local_948 + (ulong)*(uint *)(lVar21 + 4 + lVar22) * (long)p_Var10);
              afStack_90c[3] = *pfVar5;
              afStack_90c[4] = pfVar5[1];
              afStack_90c[5] = pfVar5[2];
              afStack_90c[6] = pfVar5[3];
              lVar21 = (ulong)*(uint *)(lVar21 + 8 + lVar22) * (long)p_Var10;
              local_8f0 = *(undefined1 (*) [16])(local_948 + lVar21);
              auVar35._0_4_ = afStack_90c[3] - local_8e0;
              auVar35._4_4_ = afStack_90c[4] - fStack_8dc;
              auVar35._8_4_ = afStack_90c[5] - fStack_8d8;
              auVar35._12_4_ = afStack_90c[6] - fStack_8d4;
              local_8d0 = divps(_DAT_01feca10,auVar35);
              auVar11._4_4_ = local_8f0._4_4_ - afStack_90c[4];
              auVar11._0_4_ = local_8f0._0_4_ - afStack_90c[3];
              auVar11._8_4_ = local_8f0._8_4_ - afStack_90c[5];
              auVar11._12_4_ = local_8f0._12_4_ - afStack_90c[6];
              local_8c0 = divps(_DAT_01feca10,auVar11);
              auVar28._0_4_ = local_8e0 - local_8f0._0_4_;
              auVar28._4_4_ = fStack_8dc - local_8f0._4_4_;
              auVar28._8_4_ = fStack_8d8 - local_8f0._8_4_;
              auVar28._12_4_ = fStack_8d4 - local_8f0._12_4_;
              local_8b0 = divps(_DAT_01feca10,auVar28);
              local_990._4_4_ = (float)((ulong)local_990 >> 0x20);
              uStack_988._4_4_ = (float)((ulong)uStack_988 >> 0x20);
              if (uVar24 < uVar19) {
                fVar42 = *(float *)((long)&local_940 + lVar15 * 4);
                fVar43 = *(float *)((long)&local_920 + lVar15 * 4);
                uVar18 = uVar24;
                do {
                  uVar20 = (undefined4)lVar21;
                  uVar23 = uVar18 + 1;
                  if ((long)uVar23 < 0) {
                    uVar20 = (undefined4)(uVar23 >> 1);
                  }
                  fVar30 = (float)uVar23 * fVar43 + fVar42;
                  lVar21 = 0;
                  auVar32 = _DAT_01feb9f0;
                  auVar48 = _DAT_01feba00;
                  auVar53 = _DAT_01feb9f0;
                  auVar54 = _DAT_01feba00;
                  do {
                    fVar37 = *(float *)(puVar27 + lVar21);
                    if (fVar37 <= fVar30) {
                      auVar32 = minps(auVar32,*(undefined1 (*) [16])(local_910 + lVar21));
                      auVar48 = maxps(auVar48,*(undefined1 (*) [16])(local_910 + lVar21));
                    }
                    if (fVar30 <= fVar37) {
                      auVar53 = minps(auVar53,*(undefined1 (*) [16])(local_910 + lVar21));
                      auVar54 = maxps(auVar54,*(undefined1 (*) [16])(local_910 + lVar21));
                    }
                    if (((fVar37 < fVar30) && (fVar30 < *(float *)(puVar27 + lVar21 + 0x10))) ||
                       ((fVar30 < fVar37 && (*(float *)(puVar27 + lVar21 + 0x10) < fVar30)))) {
                      fVar37 = (fVar30 - fVar37) * *(float *)(puVar27 + lVar21 + 0x40);
                      auVar52._0_4_ =
                           (*(float *)((long)afStack_90c + lVar21 + 0xc) -
                           *(float *)(local_910 + lVar21)) * fVar37 + *(float *)(local_910 + lVar21)
                      ;
                      auVar52._4_4_ =
                           (*(float *)((long)afStack_90c + lVar21 + 0x10) -
                           *(float *)(local_910 + lVar21 + 4)) * fVar37 +
                           *(float *)(local_910 + lVar21 + 4);
                      auVar52._8_4_ =
                           (*(float *)((long)afStack_90c + lVar21 + 0x14) -
                           *(float *)(local_910 + lVar21 + 8)) * fVar37 +
                           *(float *)(local_910 + lVar21 + 8);
                      auVar52._12_4_ =
                           (*(float *)(local_8f0 + lVar21 + -4) -
                           *(float *)(local_910 + lVar21 + 0xc)) * fVar37 +
                           *(float *)(local_910 + lVar21 + 0xc);
                      auVar32 = minps(auVar32,auVar52);
                      auVar48 = maxps(auVar48,auVar52);
                      auVar53 = minps(auVar53,auVar52);
                      auVar54 = maxps(auVar54,auVar52);
                    }
                    lVar21 = lVar21 + 0x10;
                  } while (lVar21 != 0x30);
                  auVar32 = maxps(auVar32,(undefined1  [16])local_9a0);
                  auVar12._4_4_ = local_990._4_4_;
                  auVar12._0_4_ = (float)local_990;
                  auVar12._8_4_ = (float)uStack_988;
                  auVar12._12_4_ = uStack_988._4_4_;
                  auVar48 = minps(auVar48,auVar12);
                  auVar49._4_4_ = -(uint)(auVar32._4_4_ <= auVar48._4_4_);
                  auVar49._0_4_ = -(uint)(auVar32._0_4_ <= auVar48._0_4_);
                  auVar49._8_4_ = -(uint)(auVar32._8_4_ <= auVar48._8_4_);
                  auVar49._12_4_ = -(uint)(auVar32._12_4_ <= auVar48._12_4_);
                  uVar20 = movmskps(uVar20,auVar49);
                  if ((~(byte)uVar20 & 7) != 0) {
                    uVar26 = uVar26 + 1;
                  }
                  local_9a0.m128 = (__m128)maxps(auVar53,local_9a0.m128);
                  auVar13._4_4_ = local_990._4_4_;
                  auVar13._0_4_ = (float)local_990;
                  auVar13._8_4_ = (float)uStack_988;
                  auVar13._12_4_ = uStack_988._4_4_;
                  auVar54 = minps(auVar54,auVar13);
                  lVar21 = lVar15 * 0x20;
                  auVar53 = *(undefined1 (*) [16])((long)local_870 + lVar15 * 0x20 + uVar18 * 0x60);
                  auVar32 = minps(*(undefined1 (*) [16])(&local_880 + uVar18 * 6 + lVar15 * 2U),
                                  auVar32);
                  (&local_880)[uVar18 * 6 + lVar15 * 2U] =
                       (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar32;
                  auVar32 = maxps(auVar53,auVar48);
                  *(undefined1 (*) [16])((long)local_870 + lVar15 * 0x20 + uVar18 * 0x60) = auVar32;
                  local_990._0_4_ = auVar54._0_4_;
                  local_990._4_4_ = auVar54._4_4_;
                  uStack_988._0_4_ = auVar54._8_4_;
                  uStack_988._4_4_ = auVar54._12_4_;
                  uVar24 = uVar19;
                  uVar18 = uVar23;
                } while (uVar23 != uVar19);
              }
              auVar29._4_4_ = -(uint)(local_9a0.m128[1] <= local_990._4_4_);
              auVar29._0_4_ = -(uint)(local_9a0.m128[0] <= (float)local_990);
              auVar29._8_4_ = -(uint)(local_9a0.m128[2] <= (float)uStack_988);
              auVar29._12_4_ = -(uint)((float)local_9a0.m128[3] <= uStack_988._4_4_);
              uVar20 = movmskps((int)uVar19,auVar29);
              if ((~(byte)uVar20 & 7) != 0) {
                uVar25 = uVar25 - 1;
              }
              piVar3 = (int *)((long)local_280 + lVar15 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)((long)local_180 + lVar15 * 4 + uVar25 * 0x10);
              *piVar3 = *piVar3 + 1;
              auVar32 = *(undefined1 (*) [16])((long)local_870 + lVar15 * 0x20 + uVar24 * 0x60);
              auVar48 = minps(*(undefined1 (*) [16])(&local_880 + uVar24 * 6 + lVar15 * 2U),
                              (undefined1  [16])local_9a0);
              (&local_880)[uVar24 * 6 + lVar15 * 2U] =
                   (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar48;
              auVar14._4_4_ = local_990._4_4_;
              auVar14._0_4_ = (float)local_990;
              auVar14._8_4_ = (float)uStack_988;
              auVar14._12_4_ = uStack_988._4_4_;
              auVar32 = maxps(auVar32,auVar14);
              *(undefined1 (*) [16])((long)local_870 + lVar15 * 0x20 + uVar24 * 0x60) = auVar32;
            }
          }
          lVar15 = lVar15 + 1;
          puVar27 = puVar27 + 4;
        } while (lVar15 != 3);
      }
      uVar16 = uVar16 + 1;
      local_960 = uVar8;
    } while (uVar16 != uVar8);
  }
  apSStack_980[1] = __return_storage_ptr__;
  local_970 = logBlockSize;
  SpatialBinInfo<16UL,_embree::PrimRef>::best
            (__return_storage_ptr__,(SpatialBinInfo<16UL,_embree::PrimRef> *)&local_880.field_1,
             (SpatialBinMapping<16UL> *)&local_940,logBlockSize);
  return __return_storage_ptr__;
}

Assistant:

sequential_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty); 
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          binner.bin2(splitterFactory,prims0,set.begin(),set.end(),mapping);
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }